

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::isbadport::test_method(isbadport *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  uint16_t port;
  size_t total_bad_ports;
  char *in_stack_fffffffffffffba8;
  lazy_ostream *in_stack_fffffffffffffbb0;
  assertion_result *in_stack_fffffffffffffbb8;
  const_string *in_stack_fffffffffffffbd0;
  const_string *msg;
  size_t in_stack_fffffffffffffbd8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffbe0;
  char *file;
  unit_test_log_t *in_stack_fffffffffffffbe8;
  unit_test_log_t *this_00;
  unsigned_short local_34e;
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  const_string local_2f0;
  long local_2e0;
  const_string local_2d8;
  lazy_ostream local_2b8 [2];
  assertion_result local_298 [2];
  const_string local_260 [2];
  lazy_ostream local_240 [2];
  assertion_result local_220 [2];
  const_string local_1e8 [2];
  lazy_ostream local_1c8 [2];
  assertion_result local_1a8 [2];
  const_string local_170 [2];
  lazy_ostream local_150 [2];
  assertion_result local_130 [2];
  const_string local_f8 [2];
  lazy_ostream local_d8 [2];
  assertion_result local_b8 [2];
  const_string local_80 [2];
  lazy_ostream local_60 [2];
  assertion_result local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd0);
    IsBadPort((uint16_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffbb8,SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffbb0,(basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    in_stack_fffffffffffffba8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_40,local_60,local_80,0x256,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffba8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd0);
    IsBadPort((uint16_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffbb8,SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffbb0,(basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    in_stack_fffffffffffffba8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_b8,local_d8,local_f8,599,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffba8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd0);
    IsBadPort((uint16_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffbb8,SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffbb0,(basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    in_stack_fffffffffffffba8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_130,local_150,local_170,600,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffba8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd0);
    IsBadPort((uint16_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffbb8,SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffbb0,(basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    in_stack_fffffffffffffba8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a8,local_1c8,local_1e8,0x25a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffba8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd0);
    IsBadPort((uint16_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffbb8,SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffbb0,(basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    in_stack_fffffffffffffba8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_220,local_240,local_260,0x25b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffba8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd0);
    IsBadPort((uint16_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffbb8,SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffbb0,(basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    in_stack_fffffffffffffba8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_298,local_2b8,&local_2d8,0x25c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffba8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_2e0 = 0;
  for (local_34e = std::numeric_limits<unsigned_short>::max(); local_34e != 0;
      local_34e = local_34e - 1) {
    bVar1 = IsBadPort((uint16_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    if (bVar1) {
      local_2e0 = local_2e0 + 1;
    }
  }
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
    ;
    msg = &local_2f0;
    this_00 = (unit_test_log_t *)0x66;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    line_num = local_300;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffbb0,(char (*) [1])in_stack_fffffffffffffba8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8,
               (pointer)in_stack_fffffffffffffbb0,(unsigned_long)in_stack_fffffffffffffba8);
    in_stack_fffffffffffffbb8 = (assertion_result *)0x1bd030b;
    in_stack_fffffffffffffbb0 = (lazy_ostream *)&stack0xfffffffffffffccc;
    in_stack_fffffffffffffba8 = "total_bad_ports";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_320,&stack0xfffffffffffffcd0,0x265,1,2,&local_2e0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffba8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(isbadport)
{
    BOOST_CHECK(IsBadPort(1));
    BOOST_CHECK(IsBadPort(22));
    BOOST_CHECK(IsBadPort(6000));

    BOOST_CHECK(!IsBadPort(80));
    BOOST_CHECK(!IsBadPort(443));
    BOOST_CHECK(!IsBadPort(8333));

    // Check all ports, there must be 80 bad ports in total.
    size_t total_bad_ports{0};
    for (uint16_t port = std::numeric_limits<uint16_t>::max(); port > 0; --port) {
        if (IsBadPort(port)) {
            ++total_bad_ports;
        }
    }
    BOOST_CHECK_EQUAL(total_bad_ports, 80);
}